

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

void Rtm_ObjAddFanin(Rtm_Obj_t *pObj,Rtm_Obj_t *pFanin,int fCompl)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  sbyte sVar4;
  uint uVar5;
  uint uVar6;
  
  uVar3 = (ulong)(*(uint *)&pObj->field_0x8 >> 3 & 0xff0);
  *(Rtm_Obj_t **)((long)&pObj[1].pCopy + uVar3) = pFanin;
  *(undefined8 *)(&pObj[1].field_0x8 + uVar3) = 0;
  iVar1 = pFanin->nFanouts;
  (&pFanin[1].pCopy)[(int)(((*(uint *)&pFanin->field_0x8 >> 0xf) + iVar1) * 2)] = pObj;
  (&pFanin[1].pCopy)[(int)(((*(uint *)&pFanin->field_0x8 >> 0xf) + iVar1) * 2 + 1)] =
       &pObj[1].field_0x8 + (*(uint *)&pObj->field_0x8 >> 3 & 0xff0);
  uVar2 = *(uint *)&pObj->field_0x8;
  if ((char)(uVar2 >> 7) == '\0') {
    uVar5 = 0xffffffdf;
    uVar6 = 0x20;
    sVar4 = 5;
  }
  else {
    if ((uVar2 >> 7 & 0xff) != 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRet.c"
                    ,0x19f,"void Rtm_ObjAddFanin(Rtm_Obj_t *, Rtm_Obj_t *, int)");
    }
    uVar5 = 0xffffffbf;
    uVar6 = 0x40;
    sVar4 = 6;
  }
  *(uint *)&pObj->field_0x8 =
       uVar5 & uVar2 & 0xffff807f | fCompl << sVar4 & uVar6 | uVar2 + 0x80 & 0x7f80;
  iVar1 = pFanin->nFanouts;
  pFanin->nFanouts = iVar1 + 1;
  if ((*(uint *)&pObj->field_0x8 >> 7 & 0xff) <= *(uint *)&pObj->field_0x8 >> 0xf) {
    if (iVar1 < pFanin->Temp) {
      return;
    }
    __assert_fail("pFanin->nFanouts <= pFanin->Temp",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRet.c"
                  ,0x1a3,"void Rtm_ObjAddFanin(Rtm_Obj_t *, Rtm_Obj_t *, int)");
  }
  __assert_fail("pObj->nFanins <= pObj->Num",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRet.c"
                ,0x1a2,"void Rtm_ObjAddFanin(Rtm_Obj_t *, Rtm_Obj_t *, int)");
}

Assistant:

void Rtm_ObjAddFanin( Rtm_Obj_t * pObj, Rtm_Obj_t * pFanin, int fCompl )
{
    pObj->pFanio[ 2*pObj->nFanins ] = pFanin;
    pObj->pFanio[ 2*pObj->nFanins + 1 ] = NULL;
    pFanin->pFanio[ 2*(pFanin->Num + pFanin->nFanouts) ] = pObj;
    pFanin->pFanio[ 2*(pFanin->Num + pFanin->nFanouts) + 1 ] = pObj->pFanio + 2*pObj->nFanins + 1;
    if ( pObj->nFanins == 0 )
        pObj->fCompl0 = fCompl;
    else if ( pObj->nFanins == 1 )
        pObj->fCompl1 = fCompl;
    else
        assert( 0 );
    pObj->nFanins++;
    pFanin->nFanouts++;
    assert( pObj->nFanins <= pObj->Num );
    assert( pFanin->nFanouts <= pFanin->Temp );
}